

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

BOOL GetUnicodeData(INT nUnicodeValue,UnicodeDataRec *pDataRec)

{
  UnicodeDataRec *pUVar1;
  INT nNumOfChars;
  UnicodeDataRec *dataRec;
  BOOL bRet;
  UnicodeDataRec *pDataRec_local;
  INT nUnicodeValue_local;
  
  if ((uint)nUnicodeValue < 0x101) {
    *pDataRec = UnicodeData[nUnicodeValue];
    dataRec._4_4_ = 1;
  }
  else {
    pDataRec_local._4_4_ = nUnicodeValue;
    pUVar1 = (UnicodeDataRec *)
             bsearch((void *)((long)&pDataRec_local + 4),UnicodeData,0x71b,8,UnicodeDataComp);
    if (pUVar1 != (UnicodeDataRec *)0x0) {
      *pDataRec = *pUVar1;
    }
    dataRec._4_4_ = (uint)(pUVar1 != (UnicodeDataRec *)0x0);
  }
  return dataRec._4_4_;
}

Assistant:

BOOL GetUnicodeData(INT nUnicodeValue, UnicodeDataRec *pDataRec)
{
    BOOL bRet;
    if (nUnicodeValue <= UNICODE_DATA_DIRECT_ACCESS)
    {
        *pDataRec = UnicodeData[nUnicodeValue];
        bRet = TRUE;
    }
    else
    {
        UnicodeDataRec *dataRec;
        INT nNumOfChars = UNICODE_DATA_SIZE;
        dataRec = (UnicodeDataRec *) bsearch(&nUnicodeValue, UnicodeData, nNumOfChars,
                       sizeof(UnicodeDataRec), UnicodeDataComp);
        if (dataRec == NULL)
        {
            bRet = FALSE;
        }
        else
        {
            bRet = TRUE;
            *pDataRec = *dataRec;
        }
    }
    return bRet;
}